

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O0

void __thiscall
duckdb::RLEScanState<unsigned_char>::SkipInternal
          (RLEScanState<unsigned_char> *this,rle_count_t *index_pointer,idx_t skip_count)

{
  bool bVar1;
  unsigned_long uVar2;
  unsigned_long in_RDX;
  rle_count_t *in_RSI;
  RLEScanState<unsigned_char> *in_RDI;
  idx_t skip_amount;
  rle_count_t run_end;
  unsigned_long local_18;
  
  local_18 = in_RDX;
  while (local_18 != 0) {
    uVar2 = MinValue<unsigned_long>
                      (local_18,(ulong)in_RSI[in_RDI->entry_pos] - in_RDI->position_in_entry);
    local_18 = local_18 - uVar2;
    in_RDI->position_in_entry = uVar2 + in_RDI->position_in_entry;
    bVar1 = ExhaustedRun(in_RDI,in_RSI);
    if (bVar1) {
      ForwardToNextRun(in_RDI);
    }
  }
  return;
}

Assistant:

inline void SkipInternal(rle_count_t *index_pointer, idx_t skip_count) {
		while (skip_count > 0) {
			rle_count_t run_end = index_pointer[entry_pos];
			idx_t skip_amount = MinValue<idx_t>(skip_count, run_end - position_in_entry);

			skip_count -= skip_amount;
			position_in_entry += skip_amount;
			if (ExhaustedRun(index_pointer)) {
				ForwardToNextRun();
			}
		}
	}